

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O1

char * MULTILABEL::bufcache_label(labels *ld,char *c)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  *(long *)c = (long)(ld->label_v)._end - (long)(ld->label_v)._begin >> 2;
  puVar1 = (uint *)(c + 8);
  puVar3 = (ld->label_v)._begin;
  if ((ld->label_v)._end != puVar3) {
    uVar2 = 1;
    uVar4 = 0;
    do {
      *puVar1 = puVar3[uVar4];
      puVar1 = puVar1 + 1;
      uVar4 = (ulong)uVar2;
      puVar3 = (ld->label_v)._begin;
      uVar2 = uVar2 + 1;
    } while (uVar4 < (ulong)((long)(ld->label_v)._end - (long)puVar3 >> 2));
  }
  return (char *)puVar1;
}

Assistant:

char* bufcache_label(labels* ld, char* c)
{
  *(size_t*)c = ld->label_v.size();
  c += sizeof(size_t);
  for (unsigned int i = 0; i < ld->label_v.size(); i++)
  {
    *(uint32_t*)c = ld->label_v[i];
    c += sizeof(uint32_t);
  }
  return c;
}